

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::java::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field,bool immutable,
          ClassNameResolver *name_resolver,Options *options)

{
  float fVar1;
  double dVar2;
  java jVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ulong uVar6;
  Descriptor *descriptor;
  long *plVar7;
  EnumDescriptor *descriptor_00;
  long lVar8;
  undefined7 in_register_00000009;
  size_type *psVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  bool bVar13;
  AlphaNum local_e8;
  string local_b8;
  AlphaNum local_88;
  string local_50;
  
  switch(*(undefined4 *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4)) {
  case 1:
  case 3:
    pcVar11 = local_e8.digits_;
    pcVar10 = (char *)absl::lts_20240722::numbers_internal::FastIntToBuffer
                                (*(int *)(this + 0x50),pcVar11);
    local_e8.piece_._M_len = (size_t)(pcVar10 + -(long)pcVar11);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_e8.piece_._M_str = pcVar11;
    goto LAB_0028b0ec;
  case 2:
    pcVar11 = local_e8.digits_;
    lVar8 = absl::lts_20240722::numbers_internal::FastIntToBuffer(*(long *)(this + 0x50),pcVar11);
    local_e8.piece_._M_len = lVar8 - (long)pcVar11;
    local_88.piece_._M_len = 1;
    local_88.piece_._M_str = "L";
    local_e8.piece_._M_str = pcVar11;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_e8);
    return __return_storage_ptr__;
  case 4:
    pcVar11 = local_e8.digits_;
    lVar8 = absl::lts_20240722::numbers_internal::FastIntToBuffer(*(long *)(this + 0x50),pcVar11);
    local_e8.piece_._M_len = lVar8 - (long)pcVar11;
    local_e8.piece_._M_str = pcVar11;
    local_88.piece_._M_len = (size_t)local_88.digits_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,pcVar11,lVar8);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_88);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar9) {
      lVar8 = plVar7[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar8;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_e8.digits_._0_8_ = local_88.digits_._0_8_;
    local_50._M_dataplus._M_p = (pointer)local_88.piece_._M_len;
    if ((char *)local_88.piece_._M_len == local_88.digits_) {
      return __return_storage_ptr__;
    }
    goto LAB_0028b324;
  case 5:
    dVar2 = *(double *)(this + 0x50);
    if (INFINITY <= dVar2) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Double.POSITIVE_INFINITY";
      pcVar10 = "";
      goto LAB_0028b0ec;
    }
    if (dVar2 <= -INFINITY) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Double.NEGATIVE_INFINITY";
      pcVar10 = "";
      goto LAB_0028b0ec;
    }
    if (NAN(dVar2)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Double.NaN";
      pcVar10 = "";
      goto LAB_0028b0ec;
    }
    google::protobuf::io::SimpleDtoa_abi_cxx11_(dVar2);
    local_e8.piece_._M_len = local_b8._M_string_length;
    local_e8.piece_._M_str = local_b8._M_dataplus._M_p;
    local_88.piece_._M_len = 1;
    local_88.piece_._M_str = "D";
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_e8);
    break;
  case 6:
    fVar1 = *(float *)(this + 0x50);
    if (INFINITY <= fVar1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Float.POSITIVE_INFINITY";
      pcVar10 = "";
      goto LAB_0028b0ec;
    }
    if (fVar1 <= -INFINITY) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Float.NEGATIVE_INFINITY";
      pcVar10 = "";
      goto LAB_0028b0ec;
    }
    if (NAN(fVar1)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Float.NaN";
      pcVar10 = "";
      goto LAB_0028b0ec;
    }
    google::protobuf::io::SimpleFtoa_abi_cxx11_(fVar1);
    local_e8.piece_._M_len = local_b8._M_string_length;
    local_e8.piece_._M_str = local_b8._M_dataplus._M_p;
    local_88.piece_._M_len = 1;
    local_88.piece_._M_str = "F";
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_e8);
    break;
  case 7:
    jVar3 = this[0x50];
    pcVar11 = "false";
    if ((ulong)(byte)jVar3 != 0) {
      pcVar11 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar10 = pcVar11 + ((ulong)(byte)jVar3 ^ 5);
LAB_0028b0ec:
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar11,pcVar10);
    return __return_storage_ptr__;
  case 8:
    descriptor_00 = (EnumDescriptor *)google::protobuf::FieldDescriptor::enum_type();
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_50,(ClassNameResolver *)CONCAT71(in_register_00000009,immutable),descriptor_00
               ,SUB81(field,0));
    local_e8.piece_._M_len = local_50._M_string_length;
    local_e8.piece_._M_str = local_50._M_dataplus._M_p;
    local_88.piece_._M_len = 1;
    local_88.piece_._M_str = ".";
    lVar8 = google::protobuf::FieldDescriptor::default_value_enum();
    local_b8._M_string_length = **(long **)(lVar8 + 8);
    local_b8._M_dataplus._M_p = (pointer)(*(long **)(lVar8 + 8))[1];
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_e8,&local_88);
LAB_0028b1f8:
    local_e8.digits_._0_8_ = local_50.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0028b324;
  case 9:
    if (this[2] == (java)0xc) {
      if (((byte)this[1] & 1) == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar11 = "com.google.protobuf.ByteString.EMPTY";
        pcVar10 = "";
        goto LAB_0028b0ec;
      }
      absl::lts_20240722::CEscape_abi_cxx11_
                (&local_e8,(*(undefined8 **)(this + 0x50))[1],**(undefined8 **)(this + 0x50));
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      local_88.piece_._M_len = (size_t)local_e8.piece_._M_str;
      local_88.piece_._M_str = (char *)local_e8.piece_._M_len;
      absl::lts_20240722::substitute_internal::SubstituteAndAppendArray
                (__return_storage_ptr__,0x34,
                 "com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",&local_88,1);
    }
    else {
      puVar4 = *(undefined8 **)(this + 0x50);
      uVar5 = puVar4[1];
      bVar13 = uVar5 == 0;
      if ((!bVar13) && (-1 < *(char *)*puVar4)) {
        uVar6 = 1;
        do {
          uVar12 = uVar6;
          if (uVar5 == uVar12) break;
          uVar6 = uVar12 + 1;
        } while (-1 < ((char *)*puVar4)[uVar12]);
        bVar13 = uVar5 <= uVar12;
      }
      if (bVar13) {
        local_e8.piece_._M_len = 1;
        local_e8.piece_._M_str = "\"";
        absl::lts_20240722::CEscape_abi_cxx11_(&local_50,puVar4[1],*puVar4);
        local_88.piece_._M_len = local_50._M_string_length;
        local_88.piece_._M_str = local_50._M_dataplus._M_p;
        local_b8._M_dataplus._M_p = (char *)0x1;
        local_b8._M_string_length = 0x408209;
        absl::lts_20240722::StrCat_abi_cxx11_
                  ((AlphaNum *)__return_storage_ptr__,&local_e8,&local_88);
        goto LAB_0028b1f8;
      }
      absl::lts_20240722::CEscape_abi_cxx11_(&local_e8,puVar4[1],*puVar4);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      local_88.piece_._M_len = (size_t)local_e8.piece_._M_str;
      local_88.piece_._M_str = (char *)local_e8.piece_._M_len;
      absl::lts_20240722::substitute_internal::SubstituteAndAppendArray
                (__return_storage_ptr__,0x35,
                 "com.google.protobuf.Internal.stringDefaultValue(\"$0\")",&local_88,1);
    }
    local_50._M_dataplus._M_p = (pointer)local_e8.piece_._M_len;
    if ((char *)local_e8.piece_._M_len == local_e8.digits_) {
      return __return_storage_ptr__;
    }
    goto LAB_0028b324;
  case 10:
    descriptor = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_b8,(ClassNameResolver *)CONCAT71(in_register_00000009,immutable),descriptor,
               SUB81(field,0));
    local_e8.piece_._M_len = local_b8._M_string_length;
    local_e8.piece_._M_str = local_b8._M_dataplus._M_p;
    local_88.piece_._M_len = 0x15;
    local_88.piece_._M_str = ".getDefaultInstance()";
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_e8);
    break;
  default:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_e8,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/compiler/java/helpers.cc"
               ,0x215);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)&local_e8,(char (*) [16])"Can\'t get here.");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_e8);
  }
  local_e8.digits_._0_8_ = local_b8.field_2._M_allocated_capacity;
  local_50._M_dataplus._M_p = local_b8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
    return __return_storage_ptr__;
  }
LAB_0028b324:
  operator_delete(local_50._M_dataplus._M_p,local_e8.digits_._0_8_ + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(const FieldDescriptor* field, bool immutable,
                         ClassNameResolver* name_resolver, Options options) {
  // Switch on CppType since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return absl::StrCat(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      // Need to print as a signed int since Java has no unsigned.
      return absl::StrCat(static_cast<int32_t>(field->default_value_uint32()));
    case FieldDescriptor::CPPTYPE_INT64:
      return absl::StrCat(field->default_value_int64(), "L");
    case FieldDescriptor::CPPTYPE_UINT64:
      return absl::StrCat(static_cast<int64_t>(field->default_value_uint64())) +
             "L";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "Double.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "Double.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Double.NaN";
      } else {
        return absl::StrCat(io::SimpleDtoa(value), "D");
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "Float.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "Float.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Float.NaN";
      } else {
        return absl::StrCat(io::SimpleFtoa(value), "F");
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_STRING:
      if (GetType(field) == FieldDescriptor::TYPE_BYTES) {
        if (field->has_default_value()) {
          // See comments in Internal.java for gory details.
          return absl::Substitute(
              "com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",
              absl::CEscape(field->default_value_string()));
        } else {
          return "com.google.protobuf.ByteString.EMPTY";
        }
      } else {
        if (AllAscii(field->default_value_string())) {
          // All chars are ASCII.  In this case CEscape() works fine.
          return absl::StrCat(
              "\"", absl::CEscape(field->default_value_string()), "\"");
        } else {
          // See comments in Internal.java for gory details.
          return absl::Substitute(
              "com.google.protobuf.Internal.stringDefaultValue(\"$0\")",
              absl::CEscape(field->default_value_string()));
        }
      }

    case FieldDescriptor::CPPTYPE_ENUM:
      return absl::StrCat(
          name_resolver->GetClassName(field->enum_type(), immutable), ".",
          field->default_value_enum()->name());

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return absl::StrCat(
          name_resolver->GetClassName(field->message_type(), immutable),
          ".getDefaultInstance()");

      // No default because we want the compiler to complain if any new
      // types are added.
  }

  ABSL_LOG(FATAL) << "Can't get here.";
  return "";
}